

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto_ReservedRange::~DescriptorProto_ReservedRange
          (DescriptorProto_ReservedRange *this)

{
  Arena *pAVar1;
  DescriptorProto_ReservedRange *this_local;
  
  pAVar1 = MessageLite::GetArenaForAllocation((MessageLite *)this);
  if (pAVar1 == (Arena *)0x0) {
    SharedDtor(this);
    internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_);
  }
  Message::~Message(&this->super_Message);
  return;
}

Assistant:

DescriptorProto_ReservedRange::~DescriptorProto_ReservedRange() {
  // @@protoc_insertion_point(destructor:google.protobuf.DescriptorProto.ReservedRange)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}